

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

int WriteRiffHeader(WebPPicture *pic,size_t riff_size,size_t vp8l_size)

{
  ulong uVar1;
  undefined8 uVar2;
  uint32_t val;
  int iVar3;
  long in_RDI;
  uint8_t riff [21];
  undefined1 local_38 [4];
  uint8_t *data;
  
  _local_38 = 0x46464952;
  data = (uint8_t *)0x4c38505650424557;
  PutLE32((uint8_t *)0x4c38505650424557,0);
  uVar2 = _local_38;
  uVar1 = (ulong)_local_38 >> 0x20;
  val = (uint32_t)uVar1;
  _local_38 = uVar2;
  PutLE32(data,val);
  iVar3 = (**(code **)(in_RDI + 0x60))(local_38,0x15,in_RDI);
  return iVar3;
}

Assistant:

static int WriteRiffHeader(const WebPPicture* const pic, size_t riff_size,
                           size_t vp8l_size) {
  uint8_t riff[RIFF_HEADER_SIZE + CHUNK_HEADER_SIZE + VP8L_SIGNATURE_SIZE] = {
    'R', 'I', 'F', 'F', 0, 0, 0, 0, 'W', 'E', 'B', 'P',
    'V', 'P', '8', 'L', 0, 0, 0, 0, VP8L_MAGIC_BYTE,
  };
  PutLE32(riff + TAG_SIZE, (uint32_t)riff_size);
  PutLE32(riff + RIFF_HEADER_SIZE + TAG_SIZE, (uint32_t)vp8l_size);
  return pic->writer(riff, sizeof(riff), pic);
}